

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IResultCapture * Catch::getResultCapture(void)

{
  int iVar1;
  IContext *pIVar2;
  undefined4 extraout_var;
  ReusableStringStream *pRVar3;
  SourceLineInfo local_58;
  ReusableStringStream local_48;
  string local_30;
  IResultCapture *local_10;
  IResultCapture *capture;
  
  pIVar2 = getCurrentContext();
  iVar1 = (*pIVar2->_vptr_IContext[2])();
  local_10 = (IResultCapture *)CONCAT44(extraout_var,iVar1);
  if (local_10 != (IResultCapture *)0x0) {
    return local_10;
  }
  ReusableStringStream::ReusableStringStream(&local_48);
  SourceLineInfo::SourceLineInfo
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch.hpp"
             ,0x3354);
  pRVar3 = ReusableStringStream::operator<<(&local_48,&local_58);
  pRVar3 = ReusableStringStream::operator<<(pRVar3,(char (*) [26])": Internal Catch2 error: ");
  pRVar3 = ReusableStringStream::operator<<(pRVar3,(char (*) [27])"No result capture instance");
  ReusableStringStream::str_abi_cxx11_(&local_30,pRVar3);
  throw_logic_error(&local_30);
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }